

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supdup.c
# Opt level: O1

void supdup_receive(Plug *plug,int urgent,char *data,size_t len)

{
  byte val;
  char cVar1;
  PlugVtable *pPVar2;
  char cVar3;
  strbuf *buf_o;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  BinarySink *bs;
  uchar val_00;
  size_t sVar8;
  char buf [4];
  int x;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined1 local_4a;
  undefined1 local_49;
  undefined4 local_48;
  undefined4 local_44;
  BinarySink *local_40;
  strbuf *local_38;
  
  buf_o = strbuf_new();
  if (len != 0) {
    bs = buf_o->binarysink_;
    sVar8 = 0;
    local_40 = bs;
    local_38 = buf_o;
    do {
      val = data[sVar8];
      iVar7 = *(int *)((long)&plug[-6].vt + 4);
      if (iVar7 != 1) {
        if (iVar7 == 0) {
          if (val == 0x88) {
            *(undefined8 *)((long)&plug[-6].vt + 4) = 1;
          }
          else {
            BinarySink_put_byte(bs,val);
          }
        }
        goto LAB_0013afb4;
      }
      if (*(int *)&plug[-5].vt == 1) {
        if ((long)*(int *)&plug[-3].vt < 4) {
          *(byte *)((long)plug + (long)*(int *)&plug[-3].vt + -0x1c) = val;
          iVar7 = *(int *)&plug[-3].vt + 1;
          *(int *)&plug[-3].vt = iVar7;
          if (*(int *)&plug[-4].vt == iVar7) {
LAB_0013ad90:
            *(undefined4 *)&plug[-5].vt = 2;
          }
        }
        else {
          *(undefined4 *)&plug[-5].vt = 0;
        }
        goto switchD_0013ad86_caseD_85;
      }
      if (*(int *)&plug[-5].vt != 0) goto switchD_0013ad86_caseD_85;
      if (-1 < (char)val) {
        (*(code *)plug[-2].vt)(buf_o);
        goto switchD_0013ad86_caseD_85;
      }
      *(undefined4 *)&plug[-3].vt = 0;
      *(uint *)((long)&plug[-5].vt + 4) = (uint)val;
      switch((uint)val) {
      case 0x80:
        *(undefined4 *)&plug[-4].vt = 4;
        goto LAB_0013b013;
      case 0x81:
      case 0x8f:
        *(undefined4 *)&plug[-4].vt = 2;
LAB_0013b013:
        *(undefined4 *)&plug[-5].vt = 1;
        break;
      case 0x82:
      case 0x83:
      case 0x84:
      case 0x87:
      case 0x88:
      case 0x89:
      case 0x8a:
      case 0x8b:
      case 0x8c:
      case 0x8e:
      case 0x90:
      case 0x91:
      case 0x97:
      case 0x98:
        *(undefined4 *)&plug[-4].vt = 0;
        goto LAB_0013ad90;
      case 0x8d:
      case 0x93:
      case 0x94:
      case 0x95:
      case 0x96:
        *(undefined4 *)&plug[-4].vt = 1;
        *(undefined4 *)&plug[-5].vt = 1;
      }
switchD_0013ad86_caseD_85:
      if (*(int *)&plug[-5].vt != 2) goto LAB_0013af43;
      switch(*(undefined4 *)((long)&plug[-5].vt + 4)) {
      case 0x80:
        cVar3 = *(char *)((long)&plug[-4].vt + 6);
        cVar1 = *(char *)((long)&plug[-4].vt + 7);
        goto LAB_0013aeac;
      case 0x81:
      case 0x8f:
        cVar3 = *(char *)((long)&plug[-4].vt + 4);
        cVar1 = *(char *)((long)&plug[-4].vt + 5);
LAB_0013aeac:
        BinarySink_put_fmt(bs,"\x1b[%d;%dH",(ulong)((int)cVar3 + 1),(ulong)((int)cVar1 + 1));
        goto switchD_0013adc1_caseD_85;
      case 0x82:
        pcVar4 = "\x1b[J";
        break;
      case 0x83:
        pcVar4 = "\x1b[K";
        break;
      case 0x84:
        pcVar4 = "\x1b[X";
        break;
      default:
        goto switchD_0013adc1_caseD_85;
      case 0x87:
        pcVar4 = "\r\n";
        break;
      case 0x89:
        val_00 = '\b';
        goto LAB_0013af0d;
      case 0x8a:
        val_00 = '\n';
        goto LAB_0013af0d;
      case 0x8b:
        val_00 = '\r';
        goto LAB_0013af0d;
      case 0x8c:
        buf_o->len = 0;
        cVar3 = (**(code **)((plug[-0x10].vt)->log + 0xd8))(plug[-0x10].vt,&local_44,&local_48);
        if (cVar3 == '\0') {
          local_48 = 0;
          local_44 = 0;
        }
        local_4c = 0x101c;
        local_4a = (undefined1)local_48;
        local_49 = (undefined1)local_44;
        (**(code **)((plug[-0x12].vt)->log + 0x10))(plug[-0x12].vt,&local_4c,4);
        goto switchD_0013adc1_caseD_85;
      case 0x8d:
        val_00 = *(uchar *)((long)&plug[-4].vt + 4);
LAB_0013af0d:
        BinarySink_put_byte(bs,val_00);
        goto switchD_0013adc1_caseD_85;
      case 0x8e:
        pcVar4 = "\x1b[C";
        break;
      case 0x90:
        pcVar4 = "\x1b[2J\x1b[H";
        break;
      case 0x91:
        pcVar4 = "\a";
        break;
      case 0x93:
        uVar6 = (ulong)(uint)(int)*(char *)((long)&plug[-4].vt + 4);
        pcVar4 = "\x1b[%dL";
        goto LAB_0013af34;
      case 0x94:
        uVar6 = (ulong)(uint)(int)*(char *)((long)&plug[-4].vt + 4);
        pcVar4 = "\x1b[%dM";
        goto LAB_0013af34;
      case 0x95:
        uVar6 = (ulong)(uint)(int)*(char *)((long)&plug[-4].vt + 4);
        pcVar4 = "\x1b[%d@";
        goto LAB_0013af34;
      case 0x96:
        uVar6 = (ulong)(uint)(int)*(char *)((long)&plug[-4].vt + 4);
        pcVar4 = "\x1b[%dP";
LAB_0013af34:
        BinarySink_put_fmt(bs,pcVar4,uVar6);
        goto switchD_0013adc1_caseD_85;
      }
      BinarySink_put_fmt(bs,pcVar4);
switchD_0013adc1_caseD_85:
      *(undefined4 *)&plug[-5].vt = 0;
LAB_0013af43:
      if (*(char *)&plug[-8].vt == '\0') {
        local_4e = 0xc2c0;
        pcVar4 = conf_get_str((Conf *)plug[-7].vt,0x44);
        (**(code **)((plug[-0x12].vt)->log + 0x10))(plug[-0x12].vt,&local_4e,2);
        pPVar2 = plug[-0x12].vt;
        sVar5 = strlen(pcVar4);
        buf_o = local_38;
        bs = local_40;
        (**(code **)(pPVar2->log + 0x10))(pPVar2,pcVar4,sVar5 + 1);
        *(undefined1 *)&plug[-8].vt = 1;
      }
LAB_0013afb4:
      if (0xfff < buf_o->len) {
        uVar6 = (**(code **)(plug[-0x10].vt)->log)(plug[-0x10].vt,0,buf_o->u,(long)(int)buf_o->len);
        (**(code **)((plug[-0x12].vt)->log + 0x28))(plug[-0x12].vt,0x1000 < uVar6);
        buf_o->len = 0;
      }
      sVar8 = sVar8 + 1;
    } while (len != sVar8);
  }
  if (buf_o->len != 0) {
    uVar6 = (**(code **)(plug[-0x10].vt)->log)(plug[-0x10].vt,0,buf_o->u,(long)(int)buf_o->len);
    (**(code **)((plug[-0x12].vt)->log + 0x28))(plug[-0x12].vt,0x1000 < uVar6);
  }
  strbuf_free(buf_o);
  return;
}

Assistant:

static void supdup_receive(Plug *plug, int urgent, const char *data, size_t len)
{
    Supdup *supdup = container_of(plug, Supdup, plug);
    do_supdup_read(supdup, data, len);
}